

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O2

int Abc_NtkIsDfsOrdered(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  int iVar3;
  long lVar4;
  Abc_Obj_t *p;
  
  Abc_NtkIncrementTravId(pNtk);
  for (iVar3 = 0; iVar3 < pNtk->vCis->nSize; iVar3 = iVar3 + 1) {
    pAVar2 = Abc_NtkCi(pNtk,iVar3);
    Abc_NodeSetTravIdCurrent(pAVar2);
  }
  iVar3 = 0;
  do {
    if (pNtk->vObjs->nSize <= iVar3) {
      return 1;
    }
    pAVar2 = Abc_NtkObj(pNtk,iVar3);
    if ((pAVar2 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar2->field_0x14 & 0xf) == 7)) {
      lVar4 = 0;
      while (lVar4 < (pAVar2->vFanins).nSize) {
        iVar1 = Abc_NodeIsTravIdCurrent
                          ((Abc_Obj_t *)pAVar2->pNtk->vObjs->pArray[(pAVar2->vFanins).pArray[lVar4]]
                          );
        lVar4 = lVar4 + 1;
        if (iVar1 == 0) {
          return 0;
        }
      }
      if ((pNtk->ntkType == ABC_NTK_STRASH) &&
         (iVar1 = Abc_AigNodeIsChoice(pAVar2), p = pAVar2, iVar1 != 0)) {
        while (p = (Abc_Obj_t *)(p->field_5).pData, p != (Abc_Obj_t *)0x0) {
          iVar1 = Abc_NodeIsTravIdCurrent(p);
          if (iVar1 == 0) {
            return 0;
          }
        }
      }
      Abc_NodeSetTravIdCurrent(pAVar2);
    }
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

int Abc_NtkIsDfsOrdered( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode, * pFanin;
    int i, k;
    // set the traversal ID
    Abc_NtkIncrementTravId( pNtk );
    // mark the CIs
    Abc_NtkForEachCi( pNtk, pNode, i )
        Abc_NodeSetTravIdCurrent( pNode );
    // go through the nodes
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        // check the fanins of the node
        Abc_ObjForEachFanin( pNode, pFanin, k )
            if ( !Abc_NodeIsTravIdCurrent(pFanin) )
                return 0;
        // check the choices of the node
        if ( Abc_NtkIsStrash(pNtk) && Abc_AigNodeIsChoice(pNode) )
            for ( pFanin = (Abc_Obj_t *)pNode->pData; pFanin; pFanin = (Abc_Obj_t *)pFanin->pData )
                if ( !Abc_NodeIsTravIdCurrent(pFanin) )
                    return 0;
        // mark the node as visited
        Abc_NodeSetTravIdCurrent( pNode );
    }
    return 1;
}